

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void round_shift_4x4(__m128i *in,int shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  int iVar16;
  undefined1 auVar17 [16];
  
  if (shift != 0) {
    iVar16 = 1 << ((char)shift - 1U & 0x1f);
    iVar1 = *(int *)((long)*in + 4);
    lVar9 = (*in)[1];
    iVar2 = *(int *)((long)*in + 0xc);
    lVar10 = in[1][0];
    iVar3 = *(int *)((long)in[1] + 4);
    lVar11 = in[1][1];
    iVar4 = *(int *)((long)in[1] + 0xc);
    lVar12 = in[2][0];
    iVar5 = *(int *)((long)in[2] + 4);
    lVar13 = in[2][1];
    iVar6 = *(int *)((long)in[2] + 0xc);
    lVar14 = in[3][0];
    iVar7 = *(int *)((long)in[3] + 4);
    lVar15 = in[3][1];
    iVar8 = *(int *)((long)in[3] + 0xc);
    auVar17 = ZEXT416((uint)shift);
    *(int *)*in = (int)(*in)[0] + iVar16 >> auVar17;
    *(int *)((long)*in + 4) = iVar1 + iVar16 >> auVar17;
    *(int *)(*in + 1) = (int)lVar9 + iVar16 >> auVar17;
    *(int *)((long)*in + 0xc) = iVar2 + iVar16 >> auVar17;
    *(int *)in[1] = (int)lVar10 + iVar16 >> auVar17;
    *(int *)((long)in[1] + 4) = iVar3 + iVar16 >> auVar17;
    *(int *)(in[1] + 1) = (int)lVar11 + iVar16 >> auVar17;
    *(int *)((long)in[1] + 0xc) = iVar4 + iVar16 >> auVar17;
    *(int *)in[2] = (int)lVar12 + iVar16 >> auVar17;
    *(int *)((long)in[2] + 4) = iVar5 + iVar16 >> auVar17;
    *(int *)(in[2] + 1) = (int)lVar13 + iVar16 >> auVar17;
    *(int *)((long)in[2] + 0xc) = iVar6 + iVar16 >> auVar17;
    *(int *)in[3] = iVar16 + (int)lVar14 >> auVar17;
    *(int *)((long)in[3] + 4) = iVar16 + iVar7 >> auVar17;
    *(int *)(in[3] + 1) = iVar16 + (int)lVar15 >> auVar17;
    *(int *)((long)in[3] + 0xc) = iVar16 + iVar8 >> auVar17;
  }
  return;
}

Assistant:

static inline void round_shift_4x4(__m128i *in, int shift) {
  if (shift != 0) {
    __m128i rnding = _mm_set1_epi32(1 << (shift - 1));
    in[0] = _mm_add_epi32(in[0], rnding);
    in[1] = _mm_add_epi32(in[1], rnding);
    in[2] = _mm_add_epi32(in[2], rnding);
    in[3] = _mm_add_epi32(in[3], rnding);

    in[0] = _mm_srai_epi32(in[0], shift);
    in[1] = _mm_srai_epi32(in[1], shift);
    in[2] = _mm_srai_epi32(in[2], shift);
    in[3] = _mm_srai_epi32(in[3], shift);
  }
}